

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.h
# Opt level: O0

ImportMessageLite * __thiscall
proto2_unittest::TestAllTypesLite::_internal_mutable_optional_import_message(TestAllTypesLite *this)

{
  Arena *arena;
  ImportMessageLite *pIVar1;
  ImportMessageLite *p;
  TestAllTypesLite *this_local;
  
  if ((this->field_0)._impl_.optional_import_message_ == (ImportMessageLite *)0x0) {
    arena = google::protobuf::MessageLite::GetArena(&this->super_MessageLite);
    pIVar1 = (ImportMessageLite *)
             google::protobuf::Arena::DefaultConstruct<proto2_unittest_import::ImportMessageLite>
                       (arena);
    (this->field_0)._impl_.optional_import_message_ = pIVar1;
  }
  return (this->field_0)._impl_.optional_import_message_;
}

Assistant:

TestAllTypesLite::_internal_mutable_optional_import_message() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.optional_import_message_ == nullptr) {
    auto* p = ::google::protobuf::MessageLite::DefaultConstruct<::proto2_unittest_import::ImportMessageLite>(GetArena());
    _impl_.optional_import_message_ = reinterpret_cast<::proto2_unittest_import::ImportMessageLite*>(p);
  }
  return _impl_.optional_import_message_;
}